

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t generic_unpack(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  exr_coding_channel_info_t *peVar5;
  uint8_t *puVar6;
  uint uVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  short sVar12;
  int iVar13;
  float fVar14;
  uint uVar15;
  float fVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ushort uVar20;
  long lVar21;
  void *pvVar22;
  float *pfVar23;
  long lVar24;
  
  iVar3 = (decode->chunk).height;
  uVar9 = iVar3 - decode->user_line_end_ignore;
  if (uVar9 == 0 || iVar3 < decode->user_line_end_ignore) {
    return 0;
  }
  lVar21 = (long)decode->user_line_begin_skip;
  pvVar22 = decode->unpacked_buffer;
  sVar12 = decode->channel_count;
  uVar18 = 0;
  do {
    if (0 < sVar12) {
      iVar3 = (decode->chunk).start_y;
      peVar5 = decode->channels;
      uVar10 = uVar18 - lVar21;
      lVar24 = 0;
      do {
        puVar6 = peVar5[lVar24].field_12.decode_to_ptr;
        iVar4 = peVar5[lVar24].width;
        iVar13 = peVar5[lVar24].y_samples;
        cVar1 = peVar5[lVar24].bytes_per_element;
        lVar19 = (long)peVar5[lVar24].user_pixel_stride;
        if (iVar13 < 2) {
          if ((lVar21 <= (long)uVar18) && (puVar6 != (uint8_t *)0x0)) {
            lVar11 = (long)peVar5[lVar24].user_line_stride * uVar10;
            goto LAB_00131376;
          }
LAB_00131452:
          pvVar22 = (void *)((long)pvVar22 + (long)(cVar1 * iVar4));
        }
        else if ((iVar3 + (int)uVar18) % iVar13 == 0) {
          if (((long)uVar18 < lVar21) || (puVar6 == (uint8_t *)0x0)) goto LAB_00131452;
          lVar11 = (long)peVar5[lVar24].user_line_stride *
                   (long)(int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                     uVar10 & 0xffffffff) / (long)iVar13);
LAB_00131376:
          pfVar23 = (float *)(puVar6 + lVar11);
          uVar2 = peVar5[lVar24].data_type;
          if (uVar2 == 0) {
            uVar2 = peVar5[lVar24].user_data_type;
            if (uVar2 == 2) {
              if (0 < iVar4) {
                lVar11 = 0;
                do {
                  *pfVar23 = (float)*(uint *)((long)pvVar22 + lVar11 * 4);
                  pfVar23 = (float *)((long)pfVar23 + lVar19);
                  lVar11 = lVar11 + 1;
                } while (iVar4 != (int)lVar11);
              }
            }
            else if (uVar2 == 1) {
              if (0 < iVar4) {
                lVar11 = 0;
                do {
                  uVar17 = *(uint *)((long)pvVar22 + lVar11 * 4);
                  uVar20 = 0x7c00;
                  if (uVar17 < 0xffe1) {
                    fVar16 = (float)(int)uVar17;
                    if ((uint)fVar16 < 0x38800000) {
                      if ((uint)fVar16 < 0x33000001) {
                        uVar20 = 0;
                      }
                      else {
                        uVar17 = (uint)fVar16 & 0x7fffff | 0x800000;
                        cVar8 = (char)((uint)fVar16 >> 0x17);
                        uVar20 = (ushort)(uVar17 >> (0x7eU - cVar8 & 0x1f));
                        if (0x80000000 < uVar17 << (cVar8 + 0xa2U & 0x1f)) {
                          uVar20 = uVar20 + 1;
                        }
                      }
                    }
                    else if ((uint)fVar16 < 0x7f800000) {
                      if ((uint)fVar16 < 0x477ff000) {
                        uVar20 = (ushort)((int)fVar16 + 0x8000fff +
                                          (uint)(((uint)fVar16 >> 0xd & 1) != 0) >> 0xd);
                      }
                    }
                    else if (fVar16 != INFINITY) {
                      uVar17 = (uint)fVar16 >> 0xd & 0x3ff;
                      uVar20 = (ushort)(uVar17 == 0) | (ushort)uVar17 | 0x7c00;
                    }
                  }
                  *(ushort *)pfVar23 = uVar20;
                  pfVar23 = (float *)((long)pfVar23 + lVar19);
                  lVar11 = lVar11 + 1;
                } while (iVar4 != (int)lVar11);
              }
            }
            else {
              if (uVar2 != 0) {
                return 3;
              }
              if (0 < iVar4) {
                lVar11 = 0;
                do {
                  *pfVar23 = *(float *)((long)pvVar22 + lVar11 * 4);
                  pfVar23 = (float *)((long)pfVar23 + lVar19);
                  lVar11 = lVar11 + 1;
                } while (iVar4 != (int)lVar11);
              }
            }
          }
          else if (uVar2 == 2) {
            uVar2 = peVar5[lVar24].user_data_type;
            if (uVar2 == 2) {
              if (0 < iVar4) {
                lVar11 = 0;
                do {
                  *pfVar23 = *(float *)((long)pvVar22 + lVar11 * 4);
                  pfVar23 = (float *)((long)pfVar23 + lVar19);
                  lVar11 = lVar11 + 1;
                } while (iVar4 != (int)lVar11);
              }
            }
            else if (uVar2 == 1) {
              if (0 < iVar4) {
                lVar11 = 0;
                do {
                  uVar17 = *(uint *)((long)pvVar22 + lVar11 * 4);
                  uVar15 = uVar17 & 0x7fffffff;
                  uVar20 = (ushort)(uVar17 >> 0x10) & 0x8000;
                  if (uVar15 < 0x38800000) {
                    if ((0x33000000 < uVar15) &&
                       (uVar17 = uVar17 & 0x7fffff | 0x800000, cVar8 = (char)(uVar15 >> 0x17),
                       uVar20 = uVar20 | (ushort)(uVar17 >> (0x7eU - cVar8 & 0x1f)),
                       0x80000000 < uVar17 << (cVar8 + 0xa2U & 0x1f))) {
                      uVar20 = uVar20 + 1;
                    }
                  }
                  else if (uVar15 < 0x7f800000) {
                    if (uVar15 < 0x477ff000) {
                      uVar20 = (ushort)(uVar15 + 0x8000fff + (uint)((uVar15 >> 0xd & 1) != 0) >> 0xd
                                       ) | uVar20;
                    }
                    else {
                      uVar20 = uVar20 | 0x7c00;
                    }
                  }
                  else {
                    uVar20 = uVar20 | 0x7c00;
                    if (uVar15 != 0x7f800000) {
                      uVar17 = uVar15 >> 0xd & 0x3ff;
                      uVar20 = uVar20 | (ushort)uVar17 | (ushort)(uVar17 == 0);
                    }
                  }
                  *(ushort *)pfVar23 = uVar20;
                  pfVar23 = (float *)((long)pfVar23 + lVar19);
                  lVar11 = lVar11 + 1;
                } while (iVar4 != (int)lVar11);
              }
            }
            else {
              if (uVar2 != 0) {
                return 3;
              }
              if (0 < iVar4) {
                lVar11 = 0;
                do {
                  fVar16 = *(float *)((long)pvVar22 + lVar11 * 4);
                  fVar14 = 0.0;
                  if (0.0 <= fVar16) {
                    fVar14 = (float)(long)fVar16;
                    if (ABS(fVar16) == INFINITY) {
                      fVar14 = -NAN;
                    }
                    if (4.2949673e+09 < fVar16) {
                      fVar14 = -NAN;
                    }
                  }
                  *pfVar23 = fVar14;
                  pfVar23 = (float *)((long)pfVar23 + lVar19);
                  lVar11 = lVar11 + 1;
                } while (iVar4 != (int)lVar11);
              }
            }
          }
          else {
            if (uVar2 != 1) {
              return 3;
            }
            uVar2 = peVar5[lVar24].user_data_type;
            if (uVar2 == 2) {
              if (0 < iVar4) {
                lVar11 = 0;
                do {
                  uVar17 = (uint)*(short *)((long)pvVar22 + lVar11 * 2);
                  uVar15 = (uVar17 & 0x7fff) << 0xd;
                  fVar16 = (float)(uVar17 & 0x80000000);
                  if (uVar15 < 0x800000) {
                    if ((uVar17 & 0x7fff) != 0) {
                      uVar7 = 0x1f;
                      if ((uVar17 & 0x7fff) != 0) {
                        for (; uVar15 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                        }
                      }
                      iVar13 = (uVar7 ^ 0x1f) - 8;
                      fVar16 = (float)(((uint)fVar16 | uVar15 << ((byte)iVar13 & 0x1f) | 0x38800000)
                                      + iVar13 * -0x800000);
                    }
                  }
                  else if (uVar15 < 0xf800000) {
                    fVar16 = (float)(((uint)fVar16 | uVar15) + 0x38000000);
                  }
                  else {
                    fVar16 = (float)((uint)fVar16 | uVar15 | 0x7f800000);
                  }
                  *pfVar23 = fVar16;
                  pfVar23 = (float *)((long)pfVar23 + lVar19);
                  lVar11 = lVar11 + 1;
                } while (iVar4 != (int)lVar11);
              }
            }
            else if (uVar2 == 1) {
              if (0 < iVar4) {
                lVar11 = 0;
                do {
                  *(ushort *)pfVar23 = *(ushort *)((long)pvVar22 + lVar11 * 2);
                  pfVar23 = (float *)((long)pfVar23 + lVar19);
                  lVar11 = lVar11 + 1;
                } while (iVar4 != (int)lVar11);
              }
            }
            else {
              if (uVar2 != 0) {
                return 3;
              }
              if (0 < iVar4) {
                lVar11 = 0;
                do {
                  uVar20 = *(ushort *)((long)pvVar22 + lVar11 * 2);
                  uVar17 = (uint)uVar20;
                  if ((short)uVar20 < 0) {
                    fVar16 = 0.0;
                  }
                  else if ((~uVar17 & 0x7c00) == 0) {
                    fVar16 = (float)-(uint)((uVar20 & 0x3ff) == 0);
                  }
                  else {
                    uVar15 = uVar17 * 0x2000;
                    if (uVar17 < 0x400) {
                      if (uVar20 == 0) {
                        fVar16 = 0.0;
                      }
                      else {
                        uVar7 = 0x1f;
                        if (uVar17 != 0) {
                          for (; uVar15 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                          }
                        }
                        iVar13 = (uVar7 ^ 0x1f) - 8;
                        fVar16 = (float)((uVar15 << ((byte)iVar13 & 0x1f) | 0x38800000) +
                                        iVar13 * -0x800000);
                      }
                    }
                    else if (uVar17 < 0x7c00) {
                      fVar16 = (float)(uVar15 + 0x38000000);
                    }
                    else {
                      fVar16 = (float)(uVar15 | 0x7f800000);
                    }
                    fVar16 = (float)(long)fVar16;
                  }
                  *pfVar23 = fVar16;
                  pfVar23 = (float *)((long)pfVar23 + lVar19);
                  lVar11 = lVar11 + 1;
                } while (iVar4 != (int)lVar11);
              }
            }
          }
          pvVar22 = (void *)((long)pvVar22 + (long)(iVar4 * cVar1));
          sVar12 = decode->channel_count;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < sVar12);
    }
    uVar18 = uVar18 + 1;
    if (uVar18 == uVar9) {
      return 0;
    }
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc, uls;

    uls = decode->user_line_begin_skip;
    h = decode->chunk.height - decode->user_line_end_ignore;
    /*
     * user data starts at user line begin skip but because of
     * y_samples > 1 case, need to embed the run the loop and skip,
     * incrementing srcbuffer only when there'd be a line...
     */
    for (int y = 0; y < h; ++y)
    {
        int cury = (int)( (int64_t) y +
                          (int64_t) decode->chunk.start_y );

        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            w     = decc->width;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_pixel_stride;

            /* avoid a mod operation if we can */
            if (decc->y_samples > 1)
            {
                if ((cury % decc->y_samples) != 0) continue;
                if (y < uls || !cdata)
                {
                    srcbuffer += w * bpc;
                    continue;
                }

                cdata +=
                    ((uint64_t) ((y - uls) / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else
            {
                if (y < uls || !cdata)
                {
                    srcbuffer += w * bpc;
                    continue;
                }

                cdata += ((uint64_t) (y - uls)) * ((uint64_t) decc->user_line_stride);
            }

            UNPACK_SAMPLES (w)
            srcbuffer += w * bpc;
        }
    }
    return EXR_ERR_SUCCESS;
}